

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

Spectrum __thiscall
CMU462::StaticScene::AreaLight::sample_L
          (AreaLight *this,Vector3D *p,Vector3D *wi,float *distToLight,float *pdf)

{
  float fVar1;
  Spectrum SVar2;
  float fVar3;
  double dVar4;
  double local_118;
  Vector3D local_110;
  float local_f4;
  float local_f0;
  float dist;
  float sqDist;
  float cosTheta;
  Vector3D local_d0;
  Vector3D local_b8;
  Vector3D local_a0;
  undefined1 local_88 [8];
  Vector3D d;
  Vector2D local_60;
  undefined1 local_50 [8];
  Vector2D sample;
  float *pdf_local;
  float *distToLight_local;
  Vector3D *wi_local;
  Vector3D *p_local;
  AreaLight *this_local;
  undefined4 uStack_10;
  float local_c;
  
  sample.y = (double)pdf;
  UniformGridSampler2D::get_sample((UniformGridSampler2D *)&local_60);
  Vector2D::Vector2D((Vector2D *)&d.z,0.5,0.5);
  Vector2D::operator-((Vector2D *)local_50,&local_60);
  CMU462::operator*(&local_d0,(double *)local_50,&this->dim_x);
  Vector3D::operator+(&local_b8,&this->position,&local_d0);
  CMU462::operator*((Vector3D *)&sqDist,&sample.x,&this->dim_y);
  Vector3D::operator+(&local_a0,&local_b8,(Vector3D *)&sqDist);
  Vector3D::operator-((Vector3D *)local_88,&local_a0,p);
  dVar4 = dot((Vector3D *)local_88,&this->direction);
  dist = (float)dVar4;
  dVar4 = Vector3D::norm2((Vector3D *)local_88);
  local_f0 = (float)dVar4;
  dVar4 = std::sqrt((double)(ulong)(uint)local_f0);
  local_f4 = SUB84(dVar4,0);
  local_118 = (double)local_f4;
  Vector3D::operator/(&local_110,(Vector3D *)local_88,&local_118);
  fVar3 = local_f0;
  wi->x = local_110.x;
  wi->y = local_110.y;
  wi->z = local_110.z;
  *distToLight = local_f4;
  fVar1 = this->area;
  dVar4 = std::fabs((double)(ulong)(uint)dist);
  *(float *)sample.y = fVar3 / (fVar1 * SUB84(dVar4,0));
  if (0.0 <= dist) {
    Spectrum::Spectrum((Spectrum *)((long)&this_local + 4),0.0,0.0,0.0);
  }
  else {
    this_local._4_4_ = (this->radiance).r;
    uStack_10 = (this->radiance).g;
    local_c = (this->radiance).b;
  }
  SVar2.b = local_c;
  SVar2.r = (float)this_local._4_4_;
  SVar2.g = (float)uStack_10;
  return SVar2;
}

Assistant:

Spectrum AreaLight::sample_L(const Vector3D& p, Vector3D* wi, 
                             float* distToLight, float* pdf) const {

  Vector2D sample = sampler.get_sample() - Vector2D(0.5f, 0.5f);
  Vector3D d = position + sample.x * dim_x + sample.y * dim_y - p;
  float cosTheta = dot(d, direction);
  float sqDist = d.norm2();
  float dist = sqrt(sqDist);
  *wi = d / dist;
  *distToLight = dist;
  *pdf = sqDist / (area * fabs(cosTheta));
  return cosTheta < 0 ? radiance : Spectrum();
}